

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void ON_ManagedFonts::Internal_SetFakeWindowsLogfontNames
               (ON_SimpleArray<const_ON_Font_*> *device_list)

{
  ON_Font *this;
  Stretch font_stretch;
  ON_Font *font;
  ON_Font *pOVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  wchar_t *s;
  undefined8 extraout_RAX;
  ON_wString OVar5;
  uint j;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  NameLocale name_locale;
  ON_SimpleArray<const_ON_Font_*> *this_00;
  ON_SimpleArray<const_ON_Font_*> *this_01;
  int iVar9;
  ON_wString OVar10;
  ON_wString fake_en_logfont_name;
  ON_SimpleArray<const_ON_Font_*> quartet_candidates;
  ON_Font *f;
  ON_wString local_98;
  ON_wString local_90;
  ON_wString local_88;
  ON_wString en_name;
  ON_wString loc_name;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  OVar10.m_s = (wchar_t *)(ulong)(uint)device_list->m_count;
  OVar5.m_s = (wchar_t *)0x0;
  pOVar1 = (ON_Font *)(local_40 + 8);
  this = (ON_Font *)(local_50 + 8);
  local_90.m_s = OVar10.m_s;
  do {
    if (OVar10.m_s == OVar5.m_s) {
      ON_SimpleArray<const_ON_Font_*>::QuickSort
                (device_list,ON_FontList::CompareFamilyAndWindowsLogfontName);
      ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&quartet_candidates,0x80);
      local_98.m_s = (wchar_t *)0x0;
      OVar5.m_s = (wchar_t *)0x0;
      while( true ) {
        uVar8 = (uint)OVar5.m_s;
        if ((uint)OVar10.m_s <= uVar8) break;
        fake_en_logfont_name.m_s = (wchar_t *)device_list->m_a[(ulong)OVar5.m_s & 0xffffffff];
        if ((ON_Font *)fake_en_logfont_name.m_s == (ON_Font *)0x0) {
          OVar5.m_s = (wchar_t *)(ulong)(uVar8 + 1);
        }
        else {
          if (-1 < quartet_candidates.m_capacity) {
            quartet_candidates.m_count = 0;
          }
          ON_SimpleArray<const_ON_Font_*>::Append
                    (&quartet_candidates,(ON_Font **)&fake_en_logfont_name);
          OVar5.m_s = (wchar_t *)(ulong)(uVar8 + 1);
          while ((((uint)OVar5.m_s < (uint)OVar10.m_s &&
                  (f = device_list->m_a[(long)OVar5.m_s], f != (ON_Font *)0x0)) &&
                 (iVar3 = ON_FontList::CompareFamilyAndWindowsLogfontName
                                    ((ON_Font **)&fake_en_logfont_name,&f), iVar3 == 0))) {
            ON_SimpleArray<const_ON_Font_*>::Append(&quartet_candidates,&f);
            OVar5.m_s = OVar5.m_s + 1;
          }
          uVar4 = (ulong)(uint)quartet_candidates.m_count;
          if (1 < uVar4) {
            ON_SimpleArray<const_ON_Font_*>::QuickSort
                      (&quartet_candidates,ON_FontList::CompareStretch);
            uVar8 = (uint)(*quartet_candidates.m_a)->m_font_stretch;
            iVar6 = 5 - (uint)(*quartet_candidates.m_a)->m_font_stretch;
            iVar3 = -iVar6;
            if (0 < iVar6) {
              iVar3 = iVar6;
            }
            bVar2 = false;
            for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
              iVar9 = 5 - (uint)quartet_candidates.m_a[uVar7]->m_font_stretch;
              iVar6 = -iVar9;
              if (0 < iVar9) {
                iVar6 = iVar9;
              }
              if (iVar6 < iVar3) {
                bVar2 = true;
                uVar8 = (uint)quartet_candidates.m_a[uVar7]->m_font_stretch;
                iVar3 = iVar6;
              }
            }
            if (bVar2) {
              local_88.m_s = OVar5.m_s;
              for (uVar7 = 0; OVar10.m_s = local_90.m_s, OVar5.m_s = local_88.m_s, uVar4 != uVar7;
                  uVar7 = uVar7 + 1) {
                pOVar1 = quartet_candidates.m_a[uVar7];
                font_stretch = pOVar1->m_font_stretch;
                if (font_stretch != (Stretch)uVar8) {
                  ON_wString::ON_wString((ON_wString *)&f,L" (");
                  s = ON_Font::StretchToWideString(font_stretch);
                  ON_wString::operator+=((ON_wString *)&f,s);
                  iVar3 = ON_wString::Length((ON_wString *)&f);
                  if (2 < iVar3) {
                    ON_wString::operator+=((ON_wString *)&f,L")");
                    ON_wString::operator+(&loc_name,&pOVar1->m_loc_windows_logfont_name);
                    ON_wString::operator+(&en_name,&pOVar1->m_en_windows_logfont_name);
                    ON_wString::ON_wString(&local_70,&loc_name);
                    ON_wString::ON_wString(&local_60,&en_name);
                    Internal_SetFakeWindowsLogfontName(pOVar1,&local_70,&local_60);
                    ON_wString::~ON_wString(&local_60);
                    ON_wString::~ON_wString(&local_70);
                    ON_wString::~ON_wString(&en_name);
                    ON_wString::~ON_wString(&loc_name);
                    local_98.m_s = (wchar_t *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  ON_wString::~ON_wString((ON_wString *)&f);
                }
              }
            }
          }
        }
      }
      if (((ulong)local_98.m_s & 1) != 0) {
        ON_SimpleArray<const_ON_Font_*>::QuickSort
                  (device_list,ON_FontList::CompareFamilyAndWindowsLogfontName);
      }
      ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&quartet_candidates);
      return;
    }
    font = device_list->m_a[(long)OVar5.m_s];
    if (font != (ON_Font *)0x0) {
      name_locale = (NameLocale)font;
      local_88.m_s = OVar5.m_s;
      ON_Font::FamilyName(pOVar1,name_locale);
      ON_Font::PostScriptName((ON_Font *)local_40,name_locale);
      ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames
                ((ON_Font *)&quartet_candidates,(ON_wString *)pOVar1,(ON_wString *)local_40);
      ON_wString::~ON_wString((ON_wString *)local_40);
      ON_wString::~ON_wString((ON_wString *)pOVar1);
      bVar2 = ON_wString::IsEmpty((ON_wString *)&quartet_candidates);
      OVar10.m_s = local_90.m_s;
      if (!bVar2) {
        ON_Font::FamilyName(this,name_locale);
        ON_Font::PostScriptName((ON_Font *)local_50,name_locale);
        ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames
                  ((ON_Font *)&fake_en_logfont_name,(ON_wString *)this,(ON_wString *)local_50);
        ON_wString::~ON_wString((ON_wString *)local_50);
        ON_wString::~ON_wString((ON_wString *)this);
        bVar2 = ON_wString::IsEmpty(&fake_en_logfont_name);
        if (bVar2) {
          ON_wString::operator=(&fake_en_logfont_name,(ON_wString *)&quartet_candidates);
        }
        else {
          bVar2 = ON_wString::EqualOrdinal
                            ((ON_wString *)&quartet_candidates,&fake_en_logfont_name,true);
          if (!bVar2) {
            ON_Font::FamilyName((ON_Font *)&f,name_locale);
            bVar2 = ON_wString::EqualOrdinal
                              ((ON_wString *)&quartet_candidates,(ON_wString *)&f,true);
            local_98.m_s._0_1_ = bVar2;
            ON_wString::~ON_wString((ON_wString *)&f);
            ON_Font::FamilyName((ON_Font *)&f,name_locale);
            this_00 = (ON_SimpleArray<const_ON_Font_*> *)&fake_en_logfont_name;
            bVar2 = ON_wString::EqualOrdinal((ON_wString *)this_00,(ON_wString *)&f,true);
            ON_wString::~ON_wString((ON_wString *)&f);
            this_01 = &quartet_candidates;
            if ((char)local_98.m_s != '\x01' || bVar2) {
              this_01 = (ON_SimpleArray<const_ON_Font_*> *)&fake_en_logfont_name;
              this_00 = &quartet_candidates;
              if ((char)local_98.m_s != '\0' || !bVar2) goto LAB_004a7f73;
            }
            ON_wString::operator=((ON_wString *)this_01,(ON_wString *)this_00);
          }
        }
LAB_004a7f73:
        ON_wString::ON_wString(&local_68,(ON_wString *)&quartet_candidates);
        ON_wString::ON_wString(&local_58,&fake_en_logfont_name);
        Internal_SetFakeWindowsLogfontName(font,&local_68,&local_58);
        OVar10.m_s = local_90.m_s;
        ON_wString::~ON_wString(&local_58);
        ON_wString::~ON_wString(&local_68);
        ON_wString::~ON_wString(&fake_en_logfont_name);
      }
      ON_wString::~ON_wString((ON_wString *)&quartet_candidates);
      OVar5.m_s = local_88.m_s;
    }
    OVar5.m_s = OVar5.m_s + 1;
  } while( true );
}

Assistant:

void ON_ManagedFonts::Internal_SetFakeWindowsLogfontNames(
  ON_SimpleArray<const ON_Font*>& device_list
)
{
  // Windows divides font families (which can have many faces) 
  // into LOGFONT subsets identified by a logfont name.
  // A LOGFONT subset can have at most 4 faces and typically 
  // they are regular/bold/italic/bold-italic variations of 
  // a face and all have matching stretch.
  //
  // This all goes back to the 1970's and early user interfaces
  // that selected fonts based on a name, bold=true/false, italic=true/false
  // style inteface. This type of archaic font selection interface is way 
  // too simple to accomodate the rich font families are currently in use.
  // Newer font families can have dozens of faces with severeal weights,
  // several widths, and an upright and italic version of each of these.
  // However, that does not prevent applications like Rhino 6/7 
  // from attempting to use the inadequate and archic bold/italic font
  // selection interface to select a font from a rich list of modern fonts.
  //
  // This function is used on non Windows platforms to partition 
  // the installed font families into subsets with the same
  // width and set a unique fake LOGFONT name. Later sorting will
  // choose up to four faces from each subset to use as the 
  // regular/bold/italic/bold-italic representatives.

  // Assign a fake logfont name.
  const unsigned int font_count = device_list.UnsignedCount();
  for (unsigned int i = 0; i < font_count; ++i)
  {
    const ON_Font* f0 = device_list[i];
    if (nullptr == f0)
      continue;

    ON_wString fake_loc_logfont_name = ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames(
      f0->FamilyName(ON_Font::NameLocale::LocalizedFirst),
      f0->PostScriptName(ON_Font::NameLocale::LocalizedFirst)
    );
    if (fake_loc_logfont_name.IsEmpty())
      continue;
    ON_wString fake_en_logfont_name = ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames(
      f0->FamilyName(ON_Font::NameLocale::English),
      f0->PostScriptName(ON_Font::NameLocale::English)
    );
    if (fake_en_logfont_name.IsEmpty())
      fake_en_logfont_name = fake_loc_logfont_name;
    else if (false == fake_loc_logfont_name.EqualOrdinal(fake_en_logfont_name, true))
    {
      const bool bLocalFaceIsFamilyName = fake_loc_logfont_name.EqualOrdinal(f0->FamilyName(ON_Font::NameLocale::LocalizedFirst), true);
      const bool bEnglishFaceIsFamilyName = fake_en_logfont_name.EqualOrdinal(f0->FamilyName(ON_Font::NameLocale::English), true);
      if (bLocalFaceIsFamilyName && false == bEnglishFaceIsFamilyName)
        fake_loc_logfont_name = fake_en_logfont_name;
      else if (bEnglishFaceIsFamilyName && false == bLocalFaceIsFamilyName)
        fake_en_logfont_name = fake_loc_logfont_name;
    }

    ON_ManagedFonts::Internal_SetFakeWindowsLogfontName(
      f0,
      fake_loc_logfont_name,
      fake_en_logfont_name
    );
  }

  // Sort device_list by font family and current fake LOGFONT name
  device_list.QuickSort(ON_FontList::CompareFamilyAndWindowsLogfontName);
  ON_SimpleArray<const ON_Font*> quartet_candidates(128);
  bool bSortAgain = false;
  for (unsigned int i = 0; i < font_count; ++i)
  {
    const ON_Font* f0 = device_list[i];
    if (nullptr == f0)
      continue;

    quartet_candidates.SetCount(0);
    quartet_candidates.Append(f0);
    while( (i + 1) < font_count )
    {
      const ON_Font* f = device_list[i + 1];
      if (nullptr == f || 0 != ON_FontList::CompareFamilyAndWindowsLogfontName(&f0, &f))
        break;
      quartet_candidates.Append(f);
      ++i;
    }
    const unsigned int quartet_candidate_count = quartet_candidates.UnsignedCount();
    if (quartet_candidate_count < 2)
      continue;

    // members in a fake LOGFONT quartet should have the same stretch
    quartet_candidates.QuickSort(ON_FontList::CompareStretch);

    // See which subset of family gets to use the family name as 
    // the fake logfont name.
    const int medium_stretch = (int)((unsigned)(ON_Font::Stretch::Medium));
    ON_Font::Stretch stretch0 = quartet_candidates[0]->FontStretch();
    int delta_stretch = abs(medium_stretch - ((int)((unsigned)(stretch0))));
    bool bNeedToModifyFakeName = false;
    for (unsigned int j = 0; j < quartet_candidate_count; ++j)
    {
      const ON_Font::Stretch stretch = quartet_candidates[j]->FontStretch();
      int ds = abs(medium_stretch - ((int)((unsigned)(stretch))));
      if (ds < delta_stretch)
      {
        stretch0 = stretch;
        delta_stretch = ds;
        bNeedToModifyFakeName = true;
      }
    }

    if (false == bNeedToModifyFakeName)
      continue; // we cannot use stretch to distinguish between family members

    // If a family member's stretch is not stretch0, modify its names.
    for (unsigned int j = 0; j < quartet_candidate_count; ++j)
    {
      const ON_Font* f = quartet_candidates[j];
      const ON_Font::Stretch stretch = f->FontStretch();
      if (stretch == stretch0)
        continue;
      ON_wString suffix = L" (";
      suffix += ON_Font::StretchToWideString(stretch);
      if (suffix.Length() < 3)
        continue;
      suffix += L")";
      const ON_wString loc_name = f->m_loc_windows_logfont_name+suffix;
      const ON_wString en_name = f->m_en_windows_logfont_name+suffix;
      ON_ManagedFonts::Internal_SetFakeWindowsLogfontName(f,loc_name,en_name);
      bSortAgain = true;
    }
  }

  if (bSortAgain)
    device_list.QuickSort(ON_FontList::CompareFamilyAndWindowsLogfontName);

}